

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store_array_text<embree::Vec2<int>>
          (XMLWriter *this,char *name,
          vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *vec)

{
  ulong uVar1;
  size_type sVar2;
  int __oflag;
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *in_RDX;
  char *in_RSI;
  XMLWriter *in_RDI;
  size_t i;
  Vec2f *in_stack_ffffffffffffff38;
  XMLWriter *in_stack_ffffffffffffff40;
  allocator *paVar3;
  allocator local_91;
  string local_90 [32];
  float local_70;
  float local_6c;
  ulong local_68;
  allocator local_49;
  string local_48 [32];
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *local_28;
  char *local_20;
  const_reference local_10;
  float *local_8;
  
  local_28 = in_RDX;
  local_20 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,in_RSI,&local_49);
  open(in_RDI,(char *)local_48,__oflag);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_68 = 0;
  while( true ) {
    uVar1 = local_68;
    sVar2 = std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::size(local_28);
    if (sVar2 <= uVar1) break;
    tab(in_stack_ffffffffffffff40);
    local_10 = std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::operator[]
                         (local_28,local_68);
    local_8 = &local_70;
    local_70 = (float)(local_10->field_0).field_0.x;
    local_6c = (float)(local_10->field_0).field_0.y;
    store_array_elt(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_68 = local_68 + 1;
  }
  paVar3 = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,local_20,paVar3);
  close(in_RDI,(int)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return;
}

Assistant:

void XMLWriter::store_array_text(const char* name, const std::vector<T>& vec)
  {
    open(name);
    for (size_t i=0; i<vec.size(); i++) {
      tab(); store_array_elt(vec[i]);
    }
    close(name);
  }